

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewtFile.c
# Opt level: O2

newtRef NsBaseName(newtRefArg rcvr,newtRefArg r)

{
  _Bool _Var1;
  uint32_t len;
  char *pcVar2;
  newtRef nVar3;
  
  _Var1 = NewtRefIsString(r);
  if (!_Var1) {
    nVar3 = NewtThrow(-0xbd12,r);
    return nVar3;
  }
  pcVar2 = (char *)NewtRefToData(r);
  len = NewtStringLength(r);
  pcVar2 = NewtBaseName(pcVar2,len);
  if (pcVar2 != (char *)0x0) {
    nVar3 = NewtMakeString(pcVar2,false);
    return nVar3;
  }
  return r;
}

Assistant:

newtRef NsBaseName(newtRefArg rcvr, newtRefArg r)
{
    char *  base;
    
    if (! NewtRefIsString(r))
        return NewtThrow(kNErrNotAString, r);
    
    base = NewtBaseName(NewtRefToString(r), NewtStringLength(r));
    
    if (base != NULL)
        return NSSTR(base);
    else
        return r;
}